

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

void __thiscall Apt::PostProcessPaths(Apt *this)

{
  _List_node_base *p_Var1;
  _List_node_base **__x;
  _Base_ptr p_Var2;
  _List_const_iterator<TaxiTmpPos> _Var3;
  _List_const_iterator<TaxiTmpPos> __x_00;
  uint uVar4;
  listTaxiTmpPathTy *plVar5;
  double dVar6;
  size_t idxB;
  size_t idxA;
  double local_58;
  double local_50;
  size_t local_48;
  listTaxiTmpPathTy *local_40;
  ulong local_38;
  
  for (p_Var2 = mapPos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &mapPos._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if ((_Base_ptr)0x1 < p_Var2[1]._M_right) {
      AddTaxiNode(this,(double)p_Var2[1]._M_left,(double)p_Var2[1]._M_parent,0xffffffffffffffff,
                  false);
    }
  }
  local_38 = (long)(this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 6;
  plVar5 = &listPaths_abi_cxx11_;
LAB_0014cbf7:
  local_40 = (listTaxiTmpPathTy *)
             (plVar5->super__List_base<TaxiTmpPath,_std::allocator<TaxiTmpPath>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  if (local_40 == &listPaths_abi_cxx11_) {
    return;
  }
  idxA = 0xffffffffffffffff;
  idxB = 0xffffffffffffffff;
  __x = (_List_node_base **)((long)local_40 + 0x10);
  idxA = AddTaxiNode(this,*(double *)(*(long *)((long)local_40 + 0x10) + 0x18),
                     *(double *)(*(long *)((long)local_40 + 0x10) + 0x10),0xffffffffffffffff,true);
  local_48 = idxA;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&vecPathEnds,&idxA);
  __x_00._M_node = (_List_node_base *)__x;
  dVar6 = NAN;
LAB_0014cc60:
  do {
    uVar4 = 0;
    local_58 = dVar6;
    do {
      while( true ) {
        __x_00._M_node = (__x_00._M_node)->_M_next;
        _Var3 = std::prev<std::_List_const_iterator<TaxiTmpPos>>
                          ((_List_const_iterator<TaxiTmpPos>)__x,1);
        plVar5 = local_40;
        if (__x_00._M_node == _Var3._M_node) {
          p_Var1 = local_40[1].super__List_base<TaxiTmpPath,_std::allocator<TaxiTmpPath>_>._M_impl.
                   _M_node.super__List_node_base._M_next;
          idxB = AddTaxiNode(this,(double)*(_List_node_base **)((long)(p_Var1 + 1) + 8),
                             (double)p_Var1[1]._M_next,local_48,true);
          if (idxA != idxB) {
            AddTaxiEdge(this,idxA,idxB,TAXI_WAY);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&vecPathEnds,&idxB);
          }
          goto LAB_0014cbf7;
        }
        _Var3 = std::next<std::_List_const_iterator<TaxiTmpPos>>(__x_00,1);
        local_50 = CoordAngle((double)__x_00._M_node[1]._M_prev,(double)__x_00._M_node[1]._M_next,
                              (double)_Var3._M_node[1]._M_prev,(double)_Var3._M_node[1]._M_next);
        dVar6 = local_50;
        if (NAN(local_58)) goto LAB_0014cc60;
        idxB = GetSimilarTaxiNode(this,(double)__x_00._M_node[1]._M_prev,
                                  (double)__x_00._M_node[1]._M_next,0xffffffffffffffff);
        if ((idxB < local_38 || 3 < uVar4) ||
           (dVar6 = HeadingDiff(local_58,local_50), 15.0 < ABS(dVar6))) break;
        uVar4 = uVar4 + 1;
      }
      if (idxB == 0xffffffffffffffff) {
        idxB = AddTaxiNode(this,(double)__x_00._M_node[1]._M_prev,(double)__x_00._M_node[1]._M_next,
                           0xffffffffffffffff,false);
      }
    } while (idxA == idxB);
    AddTaxiEdge(this,idxA,idxB,TAXI_WAY);
    idxA = idxB;
    dVar6 = local_50;
  } while( true );
}

Assistant:

void PostProcessPaths ()
    {
        // -- 1. Identify joints and add them upfront to our network
        for (const auto& p: mapPos)
            if (p.second.isJoint())
                AddTaxiNode(p.second.lat(), p.second.lon(), ULONG_MAX, false);
        // all joints added, so up to here it is all full of joints:
        const size_t firstNonJoint = vecTaxiNodes.size();

        // -- 2. Process the edges, thereby adding more nodes
        for (const TaxiTmpPath& p: listPaths)
        {
            // The indexes to be used when adding the edge.
            // idxA points to the (already added) first node,
            // idxB to the just now added second node
            size_t idxA=ULONG_MAX, idxB=ULONG_MAX;
            
            // The first node of the entire list is definitely used, add it already
            const size_t idxA_First =
            idxA = AddTaxiNode(p.listPos.front().lat(),
                               p.listPos.front().lon());
            // Remember this node as one of the path's endpoint
            vecPathEnds.push_back(idxA);
            
            // The very last node will also be added later.
            // Between these two:
            // Combine adges til
            // a) reaching a joint, or
            // b) heading changes too much.
            // Add the remainder to the airport's taxi network
            double firstAngle = NAN;
            int numSkipped = 0;                         // number of skipped nodes in a row
            for (auto iEnd = p.listPos.cbegin();
                 iEnd != std::prev(p.listPos.cend());
                 ++iEnd)
            {
                const TaxiTmpPos& b = *iEnd;            // last node that is confirmed to be part of the edge
                const TaxiTmpPos& c = *std::next(iEnd); // next node, to be validated if still in the edge
                double bcAngle = CoordAngle(b.lat(), b.lon(), c.lat(), c.lon());
                if (std::isnan(firstAngle)) {           // new edge has just started, this is our reference angle
                    firstAngle = bcAngle;
                    numSkipped = 0;
                }
                else
                {
                    // is b a joint?
                    idxB = GetSimilarTaxiNode(b.lat(), b.lon());
                    if (idxB < firstNonJoint ||
                        // so many nodes...there's a reason for them, isn't it?
                        numSkipped >= 4 ||
                        // or has heading changed too much?
                        std::abs(HeadingDiff(firstAngle, bcAngle)) > APT_MAX_TAXI_SEGM_TURN)
                    {
                        // Add the edge to this node
                        if (idxB == ULONG_MAX)
                            idxB = AddTaxiNode(b.lat(), b.lon(), ULONG_MAX, false);
                        if (idxA != idxB) {
                            AddTaxiEdge(idxA, idxB);
                            // start a new edge, first segment will be b-c
                            idxA = idxB;
                            firstAngle = bcAngle;
                            numSkipped = 0;
                        }
                    }
                    else
                        ++numSkipped;
                }
            }
            
            // The last node of the list is also always to be added
            idxB = AddTaxiNode(p.listPos.back().lat(),
                               p.listPos.back().lon(),
                               idxA_First);     // never combine with very first node; this ensures that at least one edge will be added!
            if (idxA != idxB) {
                AddTaxiEdge(idxA, idxB);
                // Remember this node as the path's other endpoint
                vecPathEnds.push_back(idxB);
            }
        }
    }